

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_pubsub_reattach(fio_pubsub_engine_s *eng)

{
  undefined1 auVar1 [24];
  undefined1 auVar2 [24];
  fio_ch_set__ordered_s_ *local_38;
  fio_ch_set__ordered_s_ *pos_1;
  fio_ch_set__ordered_s_ *local_18;
  fio_ch_set__ordered_s_ *pos;
  fio_pubsub_engine_s *eng_local;
  
  fio_lock(&fio_postoffice.pubsub.lock);
  for (local_18 = fio_postoffice.pubsub.channels.ordered;
      local_18 != (fio_ch_set__ordered_s_ *)0x0 &&
      local_18 < fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos;
      local_18 = local_18 + 1) {
    if (local_18->hash != 0) {
      auVar1._8_8_ = local_18->obj->name;
      auVar1._0_8_ = local_18->obj->name_len;
      auVar1._16_8_ = 0;
      (*eng->subscribe)(eng,(fio_str_info_s)(auVar1 << 0x40),(fio_match_fn)0x0);
    }
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  for (local_38 = fio_postoffice.patterns.channels.ordered;
      local_38 != (fio_ch_set__ordered_s_ *)0x0 &&
      local_38 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos;
      local_38 = local_38 + 1) {
    if (local_38->hash != 0) {
      auVar2._8_8_ = local_38->obj->name;
      auVar2._0_8_ = local_38->obj->name_len;
      auVar2._16_8_ = 0;
      (*eng->subscribe)(eng,(fio_str_info_s)(auVar2 << 0x40),local_38->obj->match);
    }
  }
  fio_unlock(&fio_postoffice.patterns.lock);
  return;
}

Assistant:

void fio_pubsub_reattach(fio_pubsub_engine_s *eng) {
  fio_lock(&fio_postoffice.pubsub.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash)
      continue;
    eng->subscribe(
        eng,
        (fio_str_info_s){.data = pos->obj->name, .len = pos->obj->name_len},
        NULL);
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash)
      continue;
    eng->subscribe(
        eng,
        (fio_str_info_s){.data = pos->obj->name, .len = pos->obj->name_len},
        pos->obj->match);
  }
  fio_unlock(&fio_postoffice.patterns.lock);
}